

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupColumn
               (char *label,ImGuiTableColumnFlags flags,float init_width_or_weight,ImGuiID user_id)

{
  uint uVar1;
  ImGuiTable *table_00;
  byte bVar2;
  int iVar3;
  ImGuiTableColumn *column_00;
  size_t sVar4;
  float local_44;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiID user_id_local;
  float init_width_or_weight_local;
  ImGuiTableColumnFlags flags_local;
  char *label_local;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableSetupColumn() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                  ,0x585,
                  "void ImGui::TableSetupColumn(const char *, ImGuiTableColumnFlags, float, ImGuiID)"
                 );
  }
  if ((table_00->IsLayoutLocked & 1U) == 0) {
    if ((flags & 0xf000000U) != 0) {
      __assert_fail("(flags & ImGuiTableColumnFlags_StatusMask_) == 0 && \"Illegal to pass StatusMask values to TableSetupColumn()\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                    ,0x587,
                    "void ImGui::TableSetupColumn(const char *, ImGuiTableColumnFlags, float, ImGuiID)"
                   );
    }
    if ((int)table_00->DeclColumnsCount < table_00->ColumnsCount) {
      column_00 = ImSpan<ImGuiTableColumn>::operator[]
                            (&table_00->Columns,(int)table_00->DeclColumnsCount);
      table_00->DeclColumnsCount = table_00->DeclColumnsCount + '\x01';
      if (((((table_00->IsDefaultSizingPolicy & 1U) != 0) && ((flags & 0x18U) == 0)) &&
          ((flags & 0x1000000U) == 0)) && (0.0 < init_width_or_weight)) {
        __assert_fail("init_width_or_weight <= 0.0f && \"Can only specify width/weight if sizing policy is set explicitly in either Table or Column.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                      ,0x594,
                      "void ImGui::TableSetupColumn(const char *, ImGuiTableColumnFlags, float, ImGuiID)"
                     );
      }
      user_id_local = flags;
      if ((((flags & 0x18U) == 0) && (0.0 < init_width_or_weight)) &&
         (((table_00->Flags & 0xe000U) == 0x2000 || ((table_00->Flags & 0xe000U) == 0x4000)))) {
        user_id_local = flags | 0x10;
      }
      TableSetupColumnFlags(table_00,column_00,user_id_local);
      column_00->UserID = user_id;
      uVar1 = column_00->Flags;
      column_00->InitStretchWeightOrWidth = init_width_or_weight;
      if ((table_00->IsInitializing & 1U) != 0) {
        if ((column_00->WidthRequest <= 0.0 && column_00->WidthRequest != 0.0) &&
           (column_00->StretchWeight <= 0.0 && column_00->StretchWeight != 0.0)) {
          if (((uVar1 & 0x10) != 0) && (0.0 < init_width_or_weight)) {
            column_00->WidthRequest = init_width_or_weight;
          }
          if ((uVar1 & 8) != 0) {
            local_44 = init_width_or_weight;
            if (init_width_or_weight <= 0.0) {
              local_44 = -1.0;
            }
            column_00->StretchWeight = local_44;
          }
          if (0.0 < init_width_or_weight) {
            column_00->AutoFitQueue = '\0';
          }
        }
        if (((uVar1 & 2) != 0) && ((table_00->SettingsLoadedFlags & 4U) == 0)) {
          column_00->IsUserEnabledNextFrame = false;
          column_00->IsUserEnabled = false;
        }
        if (((uVar1 & 4) != 0) && ((table_00->SettingsLoadedFlags & 8U) == 0)) {
          column_00->SortOrder = '\0';
          bVar2 = 1;
          if ((column_00->Flags & 0x8000U) != 0) {
            bVar2 = 2;
          }
          column_00->field_0x65 = column_00->field_0x65 & 0xfc | bVar2;
        }
      }
      column_00->NameOffset = -1;
      if ((label != (char *)0x0) && (*label != '\0')) {
        iVar3 = ImGuiTextBuffer::size(&table_00->ColumnsNames);
        column_00->NameOffset = (ImS16)iVar3;
        sVar4 = strlen(label);
        ImGuiTextBuffer::append(&table_00->ColumnsNames,label,label + sVar4 + 1);
      }
    }
    else if (table_00->ColumnsCount <= (int)table_00->DeclColumnsCount) {
      __assert_fail("(table->DeclColumnsCount < table->ColumnsCount) && \"Called TableSetupColumn() too many times!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                    ,0x58a,
                    "void ImGui::TableSetupColumn(const char *, ImGuiTableColumnFlags, float, ImGuiID)"
                   );
    }
    return;
  }
  __assert_fail("table->IsLayoutLocked == false && \"Need to call call TableSetupColumn() before first row!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_tables.cpp"
                ,0x586,
                "void ImGui::TableSetupColumn(const char *, ImGuiTableColumnFlags, float, ImGuiID)")
  ;
}

Assistant:

void ImGui::TableSetupColumn(const char* label, ImGuiTableColumnFlags flags, float init_width_or_weight, ImGuiID user_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call call TableSetupColumn() before first row!");
    IM_ASSERT((flags & ImGuiTableColumnFlags_StatusMask_) == 0 && "Illegal to pass StatusMask values to TableSetupColumn()");
    if (table->DeclColumnsCount >= table->ColumnsCount)
    {
        IM_ASSERT_USER_ERROR(table->DeclColumnsCount < table->ColumnsCount, "Called TableSetupColumn() too many times!");
        return;
    }

    ImGuiTableColumn* column = &table->Columns[table->DeclColumnsCount];
    table->DeclColumnsCount++;

    // Assert when passing a width or weight if policy is entirely left to default, to avoid storing width into weight and vice-versa.
    // Give a grace to users of ImGuiTableFlags_ScrollX.
    if (table->IsDefaultSizingPolicy && (flags & ImGuiTableColumnFlags_WidthMask_) == 0 && (flags & ImGuiTableFlags_ScrollX) == 0)
        IM_ASSERT(init_width_or_weight <= 0.0f && "Can only specify width/weight if sizing policy is set explicitly in either Table or Column.");

    // When passing a width automatically enforce WidthFixed policy
    // (whereas TableSetupColumnFlags would default to WidthAuto if table is not Resizable)
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0 && init_width_or_weight > 0.0f)
        if ((table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedFit || (table->Flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;

    TableSetupColumnFlags(table, column, flags);
    column->UserID = user_id;
    flags = column->Flags;

    // Initialize defaults
    column->InitStretchWeightOrWidth = init_width_or_weight;
    if (table->IsInitializing)
    {
        // Init width or weight
        if (column->WidthRequest < 0.0f && column->StretchWeight < 0.0f)
        {
            if ((flags & ImGuiTableColumnFlags_WidthFixed) && init_width_or_weight > 0.0f)
                column->WidthRequest = init_width_or_weight;
            if (flags & ImGuiTableColumnFlags_WidthStretch)
                column->StretchWeight = (init_width_or_weight > 0.0f) ? init_width_or_weight : -1.0f;

            // Disable auto-fit if an explicit width/weight has been specified
            if (init_width_or_weight > 0.0f)
                column->AutoFitQueue = 0x00;
        }

        // Init default visibility/sort state
        if ((flags & ImGuiTableColumnFlags_DefaultHide) && (table->SettingsLoadedFlags & ImGuiTableFlags_Hideable) == 0)
            column->IsUserEnabled = column->IsUserEnabledNextFrame = false;
        if (flags & ImGuiTableColumnFlags_DefaultSort && (table->SettingsLoadedFlags & ImGuiTableFlags_Sortable) == 0)
        {
            column->SortOrder = 0; // Multiple columns using _DefaultSort will be reassigned unique SortOrder values when building the sort specs.
            column->SortDirection = (column->Flags & ImGuiTableColumnFlags_PreferSortDescending) ? (ImS8)ImGuiSortDirection_Descending : (ImU8)(ImGuiSortDirection_Ascending);
        }
    }

    // Store name (append with zero-terminator in contiguous buffer)
    column->NameOffset = -1;
    if (label != NULL && label[0] != 0)
    {
        column->NameOffset = (ImS16)table->ColumnsNames.size();
        table->ColumnsNames.append(label, label + strlen(label) + 1);
    }
}